

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O3

void sysbvm_bytecodeJit_addSourcePositionRecordWith
               (sysbvm_bytecodeJit_t *jit,size_t nativePC,sysbvm_tuple_t sourcePosition)

{
  size_t sVar1;
  _Bool _Var2;
  size_t local_20;
  sysbvm_tuple_t local_18;
  uint32_t local_10 [2];
  
  sVar1 = (jit->sourcePositions).size;
  if ((sVar1 == 0) ||
     (*(sysbvm_tuple_t *)((jit->sourcePositions).data + sVar1 * 0x18 + -0x10) != sourcePosition)) {
    local_10[0] = 0;
    local_10[1] = 0;
    local_20 = nativePC;
    local_18 = sourcePosition;
    _Var2 = sysbvm_sourcePosition_getStartLineAndColumn
                      (jit->context,sourcePosition,local_10,local_10 + 1);
    if (_Var2) {
      sysbvm_dynarray_add(&jit->sourcePositions,&local_20);
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_bytecodeJit_addSourcePositionRecordWith(sysbvm_bytecodeJit_t *jit, size_t nativePC, sysbvm_tuple_t sourcePosition)
{
    if(jit->sourcePositions.size)
    {
        sysbvm_bytecodeJitSourcePositionRecord_t *existingRecords = (sysbvm_bytecodeJitSourcePositionRecord_t*)jit->sourcePositions.data;
        if(existingRecords[jit->sourcePositions.size - 1].sourcePosition == sourcePosition)
            return;
    }

    sysbvm_bytecodeJitSourcePositionRecord_t newRecord = {0};
    newRecord.sourcePosition = sourcePosition;
    newRecord.pc = nativePC;
    if(!sysbvm_sourcePosition_getStartLineAndColumn(jit->context, sourcePosition, &newRecord.line, &newRecord.column))
        return;

    sysbvm_dynarray_add(&jit->sourcePositions, &newRecord);
}